

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_file.cpp
# Opt level: O1

BOOL SetFilePointerEx(HANDLE hFile,LARGE_INTEGER liDistanceToMove,PLARGE_INTEGER lpNewFilePointer,
                     DWORD dwMoveMethod)

{
  PAL_ERROR PVar1;
  BOOL BVar2;
  ulong in_RAX;
  CPalThread *pThread;
  PAL_ERROR *pPVar3;
  undefined8 local_38;
  LONG lDistanceToMoveHigh;
  LONG lNewFilePointerLow;
  
  local_38 = in_RAX;
  if (PAL_InitializeChakraCoreCalled) {
    local_38 = (ulong)liDistanceToMove.QuadPart >> 0x20;
    pThread = (CPalThread *)pthread_getspecific(CorUnix::thObjKey);
    if (pThread == (CPalThread *)0x0) {
      pThread = CreateCurrentThreadData();
    }
    PVar1 = CorUnix::InternalSetFilePointer
                      (pThread,hFile,liDistanceToMove.field_0.LowPart,(PLONG)&local_38,dwMoveMethod,
                       (PLONG)((long)&local_38 + 4));
    if (PVar1 == 0) {
      BVar2 = 1;
      if (lpNewFilePointer != (PLARGE_INTEGER)0x0) {
        (lpNewFilePointer->field_0).LowPart = local_38._4_4_;
        (lpNewFilePointer->field_0).HighPart = (LONG)local_38;
      }
    }
    else {
      pPVar3 = (PAL_ERROR *)__errno_location();
      *pPVar3 = PVar1;
      BVar2 = 0;
    }
    if (PAL_InitializeChakraCoreCalled != false) {
      return BVar2;
    }
  }
  abort();
}

Assistant:

BOOL
PALAPI
SetFilePointerEx(
           IN HANDLE hFile,
           IN LARGE_INTEGER liDistanceToMove,
           OUT PLARGE_INTEGER lpNewFilePointer,
           IN DWORD dwMoveMethod)
{
    PAL_ERROR palError = NO_ERROR;
    CPalThread *pThread;
    BOOL Ret = FALSE;

    PERF_ENTRY(SetFilePointerEx);
    ENTRY("SetFilePointerEx(hFile=%p, liDistanceToMove=0x%llx, "
           "lpNewFilePointer=%p (0x%llx), dwMoveMethod=0x%x)\n", hFile, 
           liDistanceToMove.QuadPart, lpNewFilePointer, 
           (lpNewFilePointer) ? (*lpNewFilePointer).QuadPart : 0, dwMoveMethod);

    LONG lDistanceToMove;
    lDistanceToMove = (LONG)liDistanceToMove.u.LowPart;
    LONG lDistanceToMoveHigh;
    lDistanceToMoveHigh = liDistanceToMove.u.HighPart;

    LONG lNewFilePointerLow = 0;

    pThread = InternalGetCurrentThread();

    palError = InternalSetFilePointer(
        pThread,
        hFile,
        lDistanceToMove,
        &lDistanceToMoveHigh,
        dwMoveMethod,
        &lNewFilePointerLow
        );

    if (NO_ERROR != palError)
    {
        pThread->SetLastError(palError);
    }
    else
    {
        if (lpNewFilePointer != NULL)
        {
            lpNewFilePointer->u.LowPart = (DWORD)lNewFilePointerLow;
            lpNewFilePointer->u.HighPart = (DWORD)lDistanceToMoveHigh;
        }
        Ret = TRUE;
    }
    
    LOGEXIT("SetFilePointerEx returns BOOL %d\n", Ret);
    PERF_EXIT(SetFilePointerEx);
    return Ret;
}